

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O1

cmCMakePath * __thiscall
cmCMakePath::Relative(cmCMakePath *__return_storage_ptr__,cmCMakePath *this,path *base)

{
  path path;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  path local_38;
  
  std::filesystem::__cxx11::path::lexically_relative(&local_38);
  std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_58,&local_38,&local_59);
  cmCMakePath<std::__cxx11::string,cmCMakePath&>(__return_storage_ptr__,&local_58,generic_format);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_38);
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath Relative(const cm::filesystem::path& base) const
  {
    auto path = this->Path.lexically_relative(base);
    // filesystem::path:lexically_relative use preferred_separator ('\') on
    // Windows) so convert back to '/'
    return path.generic_string();
  }